

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ImportSourcePtr __thiscall libcellml::Importer::importSource(Importer *this,size_t index)

{
  ImporterImpl *pIVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ImportSourcePtr IVar5;
  size_t index_local;
  Importer *this_local;
  ImportSourcePtr *importSrc;
  
  std::shared_ptr<libcellml::ImportSource>::shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)this,(nullptr_t)0x0);
  pIVar1 = pFunc((Importer *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
          ::size(&pIVar1->mImports);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pIVar1 = pFunc((Importer *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
             ::at(&pIVar1->mImports,in_RDX);
    std::shared_ptr<libcellml::ImportSource>::operator=
              ((shared_ptr<libcellml::ImportSource> *)this,pvVar3);
    _Var4._M_pi = extraout_RDX_00;
  }
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar5.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr Importer::importSource(size_t index) const
{
    ImportSourcePtr importSrc = nullptr;
    if (index < pFunc()->mImports.size()) {
        importSrc = pFunc()->mImports.at(index);
    }

    return importSrc;
}